

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O3

void __thiscall jaegertracing::samplers::Config::fromEnv(Config *this)

{
  char *pcVar1;
  size_t sVar2;
  istream *piVar3;
  char *pcVar4;
  double paramVal;
  string param;
  string samplerType;
  string samplingServerURL;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [104];
  ios_base local_130 [264];
  
  pcVar1 = getenv("JAEGER_SAMPLER_TYPE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  local_1c8 = local_1b8;
  sVar2 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar1,pcVar1 + sVar2);
  if (local_1c0 != 0) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  pcVar1 = getenv("JAEGER_SAMPLER_PARAM");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  local_1e8 = local_1d8;
  sVar2 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar1,pcVar1 + sVar2);
  if (local_1e0 != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1a8,(string *)&local_1e8,_S_in);
    piVar3 = std::istream::_M_extract<double>((double *)&local_1a8);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      this->_param = 0.0;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a8);
    std::ios_base::~ios_base(local_130);
  }
  pcVar4 = getenv("JAEGER_SAMPLING_ENDPOINT");
  pcVar1 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar1 = pcVar4;
  }
  local_1a8 = local_198;
  sVar2 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pcVar1,pcVar1 + sVar2);
  if (local_1a0 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->_samplingServerURL);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return;
}

Assistant:

void Config::fromEnv()
{
    const auto samplerType = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_TYPE_ENV_PROP);
    if (!samplerType.empty()) {
        _type = samplerType;
    }

    const auto param = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLER_PARAM_ENV_PROP);
    if (!param.empty()) {
        std::istringstream iss(param);
        double paramVal = 0;
        if (iss >> paramVal) {
            _param = paramVal;
        }
    }
    const auto samplingServerURL = utils::EnvVariable::getStringVariable(kJAEGER_SAMPLING_ENDPOINT_ENV_PROP);
    if (!samplingServerURL.empty()) {
        _samplingServerURL = samplingServerURL;
    }
}